

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O1

int pt_time_update_cyc(pt_time *time,pt_packet_cyc *packet,pt_config *config,uint64_t fcr)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint64_t uVar6;
  bool bVar7;
  
  iVar4 = -1;
  if (config != (pt_config *)0x0 && (packet != (pt_packet_cyc *)0x0 && time != (pt_time *)0x0)) {
    if (fcr == 0) {
      time->lost_cyc = time->lost_cyc + 1;
    }
    else {
      uVar5 = packet->value;
      if (time->fc == 0) {
        uVar2 = time->ctc;
        uVar1 = time->ctc_cyc;
        iVar4 = 0;
        if (uVar2 != uVar1) {
          if ((uVar2 < uVar1) &&
             (uVar2 = uVar2 + (0x100 << (config->mtc_freq & 0x1f)), uVar2 < uVar1)) {
            iVar4 = -5;
            bVar7 = true;
            uVar2 = 0;
          }
          else {
            uVar2 = uVar2 - uVar1;
            bVar7 = false;
            iVar4 = 0;
          }
          if (!bVar7) {
            if (config->cpuid_0x15_ebx == 0 || (ulong)config->cpuid_0x15_eax == 0) {
              iVar4 = -10;
            }
            else {
              iVar4 = 0;
              uVar3 = (((ulong)uVar2 * (ulong)config->cpuid_0x15_ebx) /
                       (ulong)config->cpuid_0x15_eax << 8) / fcr;
              bVar7 = uVar5 < uVar3;
              uVar5 = uVar5 - uVar3;
              if (bVar7) {
                uVar5 = 0;
              }
            }
          }
        }
        if (iVar4 < 0) {
          return iVar4;
        }
      }
      uVar6 = (uVar5 * fcr >> 8) + time->fc;
      time->fc = uVar6;
      time->tsc = uVar6 + time->base;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int pt_time_update_cyc(struct pt_time *time,
		       const struct pt_packet_cyc *packet,
		       const struct pt_config *config, uint64_t fcr)
{
	uint64_t cyc, fc;

	if (!time || !packet || !config)
		return -pte_internal;

	if (!fcr) {
		time->lost_cyc += 1;
		return 0;
	}

	cyc = packet->value;
	fc = time->fc;
	if (!fc) {
		int errcode;

		errcode = pt_time_adjust_cyc(&cyc, time, config, fcr);
		if (errcode < 0)
			return errcode;
	}

	fc += (cyc * fcr) >> pt_tcal_fcr_shr;

	time->fc = fc;
	time->tsc = time->base + fc;

	return 0;
}